

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

int __thiscall Clasp::ClaspFacade::SolveData::init(SolveData *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int iVar1;
  Enumerator *in_RDX;
  
  SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::reset(&this->en,in_RDX);
  SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject>::reset
            (&this->algo,(SolveAlgorithm *)ctx);
  SolveAlgorithm::setEnumerator
            ((SolveAlgorithm *)((this->algo).ptr_ & 0xfffffffffffffffe),
             (Enumerator *)((this->en).ptr_ & 0xfffffffffffffffe));
  if (this->interruptible == true) {
    iVar1 = (**(code **)(*(long *)((this->algo).ptr_ & 0xfffffffffffffffe) + 0x20))();
    return iVar1;
  }
  return extraout_EAX;
}

Assistant:

void ClaspFacade::SolveData::init(SolveAlgorithm* a, Enumerator* e) {
	en = e;
	algo = a;
	algo->setEnumerator(*en);
	if (interruptible) {
		this->algo->enableInterrupts();
	}
}